

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O2

ps_latlink_t * ps_lattice_reverse_edges(ps_lattice_t *dag,ps_latnode_t *start,ps_latnode_t *end)

{
  ps_latnode_t *ppVar1;
  latlink_list_t *plVar2;
  ps_latnode_t **pppVar3;
  ps_latlink_t *ppVar4;
  latlink_list_t **pplVar5;
  int iVar6;
  
  ps_lattice_delq(dag);
  pppVar3 = &dag->nodes;
  while (ppVar1 = *pppVar3, ppVar1 != (ps_latnode_t *)0x0) {
    (ppVar1->info).fanin = 0;
    iVar6 = 1;
    pplVar5 = &ppVar1->exits;
    while (plVar2 = *pplVar5, plVar2 != (latlink_list_t *)0x0) {
      (ppVar1->info).fanin = iVar6;
      iVar6 = iVar6 + 1;
      pplVar5 = &plVar2->next;
    }
    pppVar3 = &ppVar1->next;
  }
  if (end == (ps_latnode_t *)0x0) {
    end = dag->end;
  }
  pplVar5 = &end->entries;
  while (plVar2 = *pplVar5, plVar2 != (latlink_list_t *)0x0) {
    ps_lattice_pushq(dag,plVar2->link);
    pplVar5 = &plVar2->next;
  }
  ppVar4 = ps_lattice_reverse_next(dag,start);
  return ppVar4;
}

Assistant:

ps_latlink_t *
ps_lattice_reverse_edges(ps_lattice_t *dag, ps_latnode_t *start, ps_latnode_t *end)
{
    ps_latnode_t *node;
    latlink_list_t *x;

    /* Cancel any unfinished traversal. */
    ps_lattice_delq(dag);

    /* Initialize node fanout counts and path scores. */
    for (node = dag->nodes; node; node = node->next) {
        node->info.fanin = 0;
        for (x = node->exits; x; x = x->next)
            ++node->info.fanin;
    }

    /* Initialize agenda with all entries from end. */
    if (end == NULL) end = dag->end;
    for (x = end->entries; x; x = x->next)
        ps_lattice_pushq(dag, x->link);

    /* Pull the first edge off the queue. */
    return ps_lattice_reverse_next(dag, start);
}